

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::_InternalParse
          (CodeGeneratorResponse *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  char cVar5;
  uint uVar6;
  CodeGeneratorResponse_File *msg;
  uint32 res;
  uint tag;
  byte *p;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_bool> pVar8;
  
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar8._8_8_ = 0;
      pVar8.first = ptr;
    }
    else {
      pVar8._8_8_ = 1;
      pVar8.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar8 = internal::EpsCopyInputStream::DoneFallback
                          (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    p = (byte *)pVar8.first;
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)p;
    }
    bVar1 = *p;
    pVar7.second._0_1_ = bVar1;
    pVar7.first = (char *)(p + 1);
    pVar7._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = p[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar7 = internal::ReadTagFallback((char *)p,res);
      }
      else {
        pVar7.second = res;
        pVar7.first = (char *)(p + 2);
        pVar7._12_4_ = 0;
      }
    }
    ptr = pVar7.first;
    if (ptr == (char *)0x0) {
LAB_00271660:
      cVar5 = '\x04';
    }
    else {
      tag = pVar7.second;
      uVar6 = (uint)(pVar7._8_8_ >> 3) & 0x1fffffff;
      if (uVar6 == 0xf) {
        if ((char)pVar7.second != 'z') goto LAB_00271612;
        ptr = ptr + -1;
        do {
          pRVar4 = (this->file_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_00271595:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->file_).super_RepeatedPtrFieldBase,
                       (this->file_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002715a3:
            pRVar4 = (this->file_).super_RepeatedPtrFieldBase.rep_;
            pRVar4->allocated_size = pRVar4->allocated_size + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::compiler::CodeGeneratorResponse_File>
                            ((this->file_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->file_).super_RepeatedPtrFieldBase.rep_;
            iVar3 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
            (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            pRVar4->elements[iVar3] = msg;
          }
          else {
            iVar3 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar3) {
              if (pRVar4->allocated_size == (this->file_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00271595;
              goto LAB_002715a3;
            }
            (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (CodeGeneratorResponse_File *)pRVar4->elements[iVar3];
          }
          ptr = internal::ParseContext::
                ParseMessage<google::protobuf::compiler::CodeGeneratorResponse_File>
                          (ctx,msg,ptr + 1);
          if (ptr == (char *)0x0) goto LAB_00271660;
          cVar5 = '\x02';
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 'z'));
      }
      else {
        if ((uVar6 == 1) && ((char)pVar7.second == '\n')) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          if ((this->error_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstanceNoArena
                      (&this->error_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          ptr = internal::InlineGreedyStringParser((this->error_).ptr_,ptr,ctx);
        }
        else {
LAB_00271612:
          if (tag == 0 || (tag & 7) == 4) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
            cVar5 = '\t';
            goto LAB_00271655;
          }
          ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
        }
        cVar5 = (ptr == (char *)0x0) * '\x02' + '\x02';
      }
    }
LAB_00271655:
    if (cVar5 != '\x02') {
      if (cVar5 == '\x04') {
        ptr = (char *)0x0;
      }
      return ptr;
    }
  } while( true );
}

Assistant:

const char* CodeGeneratorResponse::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string error = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_error(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorResponse.error");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}